

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O3

void __thiscall
spvtools::opt::IRContext::InvalidateAnalyses(IRContext *this,Analysis analyses_to_invalidate)

{
  _Rb_tree_header *p_Var1;
  DefUseManager *__ptr;
  StructuredCFGAnalysis *__ptr_00;
  ConstantManager *__ptr_01;
  TypeManager *__ptr_02;
  DebugInfoManager *__ptr_03;
  Analysis AVar2;
  Analysis AVar3;
  
  AVar3 = analyses_to_invalidate | (kAnalysisDebugInfo|kAnalysisConstants);
  if (-1 < (short)analyses_to_invalidate) {
    AVar3 = analyses_to_invalidate;
  }
  if ((AVar3 & kAnalysisBegin) != kAnalysisNone) {
    __ptr = (this->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    (this->def_use_mgr_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
         (DefUseManager *)0x0;
    if (__ptr != (DefUseManager *)0x0) {
      std::default_delete<spvtools::opt::analysis::DefUseManager>::operator()
                ((default_delete<spvtools::opt::analysis::DefUseManager> *)&this->def_use_mgr_,__ptr
                );
    }
  }
  if ((AVar3 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    std::
    _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->instr_to_block_)._M_h);
  }
  if ((AVar3 & kAnalysisDecorations) != kAnalysisNone) {
    std::
    __uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
             *)&this->decoration_mgr_,(pointer)0x0);
  }
  if ((AVar3 & kAnalysisCombinators) != kAnalysisNone) {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>_>_>
    ::_M_deallocate_nodes
              ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>_>_>
                *)&this->combinator_ops_,
               (__node_ptr)(this->combinator_ops_)._M_h._M_before_begin._M_nxt);
    memset((this->combinator_ops_)._M_h._M_buckets,0,
           (this->combinator_ops_)._M_h._M_bucket_count << 3);
    (this->combinator_ops_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (this->combinator_ops_)._M_h._M_element_count = 0;
  }
  AVar2 = AVar3 * 2 & kAnalysisDominatorAnalysis;
  if ((AVar3 >> 0xc & 1) != 0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->builtin_var_id_map_)._M_h);
  }
  if ((AVar3 & kAnalysisCFG) != kAnalysisNone) {
    std::__uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::reset
              ((__uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_> *)
               &this->cfg_,(pointer)0x0);
  }
  if (AVar2 != kAnalysisNone || (AVar3 & kAnalysisDominatorAnalysis) != kAnalysisNone) {
    std::
    _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
    ::_M_erase(&(this->dominator_trees_)._M_t,
               (_Link_type)
               (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    p_Var1 = &(this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header;
    (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (this->dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::
    _Rb_tree<const_spvtools::opt::Function_*,_std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>,_std::_Select1st<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
    ::_M_erase(&(this->post_dominator_trees_)._M_t,
               (_Link_type)
               (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
    ;
    p_Var1 = &(this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header;
    (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (this->post_dominator_trees_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  }
  if ((char)AVar3 < '\0') {
    std::
    __uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
             *)&this->id_to_name_,(pointer)0x0);
  }
  if ((AVar3 >> 10 & 1) != 0) {
    std::
    __uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
             *)&this->vn_table_,(pointer)0x0);
  }
  if ((AVar3 >> 0xb & 1) != 0) {
    __ptr_00 = (this->struct_cfg_analysis_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
               .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl;
    (this->struct_cfg_analysis_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::StructuredCFGAnalysis,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_std::default_delete<spvtools::opt::StructuredCFGAnalysis>_>
    .super__Head_base<0UL,_spvtools::opt::StructuredCFGAnalysis_*,_false>._M_head_impl =
         (StructuredCFGAnalysis *)0x0;
    if (__ptr_00 != (StructuredCFGAnalysis *)0x0) {
      std::default_delete<spvtools::opt::StructuredCFGAnalysis>::operator()
                ((default_delete<spvtools::opt::StructuredCFGAnalysis> *)&this->struct_cfg_analysis_
                 ,__ptr_00);
    }
  }
  if ((AVar3 >> 0xd & 1) != 0) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->id_to_func_)._M_h);
  }
  if ((AVar3 >> 0xe & 1) != 0) {
    __ptr_01 = (this->constant_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
               _M_head_impl;
    (this->constant_mgr_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl =
         (ConstantManager *)0x0;
    if (__ptr_01 != (ConstantManager *)0x0) {
      std::default_delete<spvtools::opt::analysis::ConstantManager>::operator()
                ((default_delete<spvtools::opt::analysis::ConstantManager> *)&this->constant_mgr_,
                 __ptr_01);
    }
  }
  if ((AVar3 >> 0x11 & 1) != 0) {
    std::
    __uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
    ::reset((__uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
             *)&this->liveness_mgr_,(pointer)0x0);
  }
  if ((short)AVar3 < 0) {
    __ptr_02 = (this->type_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    (this->type_mgr_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl =
         (TypeManager *)0x0;
    if (__ptr_02 != (TypeManager *)0x0) {
      std::default_delete<spvtools::opt::analysis::TypeManager>::operator()
                ((default_delete<spvtools::opt::analysis::TypeManager> *)&this->type_mgr_,__ptr_02);
    }
  }
  if ((AVar3 >> 0x10 & 1) != 0) {
    __ptr_03 = (this->debug_info_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
               _M_head_impl;
    (this->debug_info_mgr_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>._M_head_impl =
         (DebugInfoManager *)0x0;
    if (__ptr_03 != (DebugInfoManager *)0x0) {
      std::default_delete<spvtools::opt::analysis::DebugInfoManager>::operator()
                ((default_delete<spvtools::opt::analysis::DebugInfoManager> *)&this->debug_info_mgr_
                 ,__ptr_03);
    }
  }
  this->valid_analyses_ = this->valid_analyses_ & ~(AVar2 | AVar3);
  return;
}

Assistant:

void IRContext::InvalidateAnalyses(IRContext::Analysis analyses_to_invalidate) {
  // The ConstantManager and DebugInfoManager contain Type pointers. If the
  // TypeManager goes away, the ConstantManager and DebugInfoManager have to
  // go away.
  if (analyses_to_invalidate & kAnalysisTypes) {
    analyses_to_invalidate |= kAnalysisConstants;
    analyses_to_invalidate |= kAnalysisDebugInfo;
  }

  // The dominator analysis hold the pseudo entry and exit nodes from the CFG.
  // Also if the CFG change the dominators many changed as well, so the
  // dominator analysis should be invalidated as well.
  if (analyses_to_invalidate & kAnalysisCFG) {
    analyses_to_invalidate |= kAnalysisDominatorAnalysis;
  }

  if (analyses_to_invalidate & kAnalysisDefUse) {
    def_use_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisInstrToBlockMapping) {
    instr_to_block_.clear();
  }
  if (analyses_to_invalidate & kAnalysisDecorations) {
    decoration_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisCombinators) {
    combinator_ops_.clear();
  }
  if (analyses_to_invalidate & kAnalysisBuiltinVarId) {
    builtin_var_id_map_.clear();
  }
  if (analyses_to_invalidate & kAnalysisCFG) {
    cfg_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisDominatorAnalysis) {
    dominator_trees_.clear();
    post_dominator_trees_.clear();
  }
  if (analyses_to_invalidate & kAnalysisNameMap) {
    id_to_name_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisValueNumberTable) {
    vn_table_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisStructuredCFG) {
    struct_cfg_analysis_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisIdToFuncMapping) {
    id_to_func_.clear();
  }
  if (analyses_to_invalidate & kAnalysisConstants) {
    constant_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisLiveness) {
    liveness_mgr_.reset(nullptr);
  }
  if (analyses_to_invalidate & kAnalysisTypes) {
    type_mgr_.reset(nullptr);
  }

  if (analyses_to_invalidate & kAnalysisDebugInfo) {
    debug_info_mgr_.reset(nullptr);
  }

  valid_analyses_ = Analysis(valid_analyses_ & ~analyses_to_invalidate);
}